

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

char * printAliasInstrEx(MCInst *MI,SStream *OS,void *info)

{
  cs_detail *pcVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  MCOperand *pMVar7;
  ulong uVar8;
  MCRegisterClass *pMVar9;
  uint8_t *puVar10;
  int64_t iVar11;
  char *s;
  char *pcVar12;
  int cr_2;
  int cr_1;
  int cr;
  MCRegisterInfo *MRI;
  int needComma;
  int decCtr;
  int PrintMethodIdx;
  int OpIdx;
  char *c;
  char *AsmOps;
  char *AsmMnem;
  char *tmp;
  char *opCode;
  SStream ss;
  void *info_local;
  SStream *OS_local;
  MCInst *MI_local;
  
  bVar3 = false;
  ss._508_8_ = info;
  SStream_Init((SStream *)((long)&opCode + 4));
  uVar5 = MCInst_getOpcode(MI);
  switch(uVar5) {
  case 0x4ed:
    tmp = "b%s";
    break;
  case 0x4ee:
    tmp = "b%sa";
    break;
  case 0x4ef:
    tmp = "b%sctr";
    break;
  case 0x4f0:
    tmp = "b%sctrl";
    break;
  case 0x4f1:
    tmp = "b%sl";
    break;
  case 0x4f2:
    tmp = "b%sla";
    break;
  case 0x4f3:
    tmp = "b%slr";
    break;
  case 0x4f4:
    tmp = "b%slrl";
    break;
  default:
    return (char *)0x0;
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      iVar11 = MCOperand_getImm(pMVar7);
      if (-1 < iVar11) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 < 2) {
          SStream_concat((SStream *)((long)&opCode + 4),tmp,"dnzf");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      iVar11 = MCOperand_getImm(pMVar7);
      if (1 < iVar11) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 < 4) {
          SStream_concat((SStream *)((long)&opCode + 4),tmp,"dzf");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      iVar11 = MCOperand_getImm(pMVar7);
      if (3 < iVar11) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 < 8) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar9 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,3);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar9,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              iVar6 = getBICRCond(uVar5);
              switch(iVar6) {
              case 0:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"ne");
                break;
              case 1:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"le");
                break;
              case 2:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"ge");
                break;
              case 3:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"ns");
              }
              pMVar7 = MCInst_getOperand(MI,0);
              iVar11 = MCOperand_getImm(pMVar7);
              if (iVar11 == 6) {
                SStream_concat0((SStream *)((long)&opCode + 4),"-");
              }
              pMVar7 = MCInst_getOperand(MI,0);
              iVar11 = MCOperand_getImm(pMVar7);
              if (iVar11 == 7) {
                SStream_concat0((SStream *)((long)&opCode + 4),"+");
              }
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      iVar11 = MCOperand_getImm(pMVar7);
      if (7 < iVar11) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 < 10) {
          SStream_concat((SStream *)((long)&opCode + 4),tmp,"dnzt");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      iVar11 = MCOperand_getImm(pMVar7);
      if (9 < iVar11) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 < 0xc) {
          SStream_concat((SStream *)((long)&opCode + 4),tmp,"dzt");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      iVar11 = MCOperand_getImm(pMVar7);
      if (0xb < iVar11) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 < 0x10) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar9 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,3);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar9,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              iVar6 = getBICRCond(uVar5);
              switch(iVar6) {
              case 0:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"eq");
                break;
              case 1:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"gt");
                break;
              case 2:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"lt");
                break;
              case 3:
                SStream_concat((SStream *)((long)&opCode + 4),tmp,"so");
              }
              pMVar7 = MCInst_getOperand(MI,0);
              iVar11 = MCOperand_getImm(pMVar7);
              if (iVar11 == 0xe) {
                SStream_concat0((SStream *)((long)&opCode + 4),"-");
              }
              pMVar7 = MCInst_getOperand(MI,0);
              iVar11 = MCOperand_getImm(pMVar7);
              if (iVar11 == 0xf) {
                SStream_concat0((SStream *)((long)&opCode + 4),"+");
              }
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getImm(pMVar7);
      if ((uVar8 & 0x12) == 0x10) {
        SStream_concat((SStream *)((long)&opCode + 4),tmp,"dnz");
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 == 0x18) {
          SStream_concat0((SStream *)((long)&opCode + 4),"-");
        }
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 == 0x19) {
          SStream_concat0((SStream *)((long)&opCode + 4),"+");
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(MI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getImm(pMVar7);
      if ((uVar8 & 0x12) == 0x12) {
        SStream_concat((SStream *)((long)&opCode + 4),tmp,"dz");
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 == 0x1a) {
          SStream_concat0((SStream *)((long)&opCode + 4),"-");
        }
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 == 0x1b) {
          SStream_concat0((SStream *)((long)&opCode + 4),"+");
        }
      }
    }
  }
  bVar2 = false;
  pMVar7 = MCInst_getOperand(MI,1);
  _Var4 = MCOperand_isReg(pMVar7);
  if (_Var4) {
    pMVar9 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,3);
    pMVar7 = MCInst_getOperand(MI,1);
    uVar5 = MCOperand_getReg(pMVar7);
    _Var4 = MCRegisterClass_contains(pMVar9,uVar5);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar11 = MCOperand_getImm(pMVar7);
        if (iVar11 < 0x10) {
          pMVar7 = MCInst_getOperand(MI,1);
          uVar5 = MCOperand_getReg(pMVar7);
          iVar6 = getBICR(uVar5);
          if (bVar3) {
            bVar2 = true;
            SStream_concat0((SStream *)((long)&opCode + 4)," ");
            if (0xb < iVar6) {
              SStream_concat((SStream *)((long)&opCode + 4),"4*cr%d+",(ulong)(iVar6 - 0xb));
            }
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            iVar6 = getBICRCond(uVar5);
            switch(iVar6) {
            case 0:
              SStream_concat0((SStream *)((long)&opCode + 4),"eq");
              op_addBC(MI,0x4c);
              break;
            case 1:
              SStream_concat0((SStream *)((long)&opCode + 4),"gt");
              op_addBC(MI,0x2c);
              break;
            case 2:
              SStream_concat0((SStream *)((long)&opCode + 4),"lt");
              op_addBC(MI,0xc);
              break;
            case 3:
              SStream_concat0((SStream *)((long)&opCode + 4),"so");
              op_addBC(MI,0x8c);
            }
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            iVar6 = getBICR(uVar5);
            if ((0xb < iVar6) && (MI->csh->detail != CS_OPT_OFF)) {
              puVar10 = MI->flat_insn->detail->groups +
                        (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1a;
              puVar10[0] = '@';
              puVar10[1] = '\0';
              puVar10[2] = '\0';
              puVar10[3] = '\0';
              puVar10 = MI->flat_insn->detail->groups +
                        (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1e;
              puVar10[0] = '\x04';
              puVar10[1] = '\0';
              puVar10[2] = '\0';
              puVar10[3] = '\0';
              *(int *)(MI->flat_insn->detail->groups +
                      (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x22) =
                   iVar6 + -8;
              *(undefined4 *)
               (MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x26) =
                   *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix;
              pcVar1 = MI->flat_insn->detail;
              (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
            }
          }
          else {
            bVar2 = 0xb < iVar6;
            if (bVar2) {
              SStream_concat((SStream *)((long)&opCode + 4)," cr%d",(ulong)(iVar6 - 0xb));
              op_addReg(MI,iVar6 - 8);
            }
          }
        }
      }
    }
  }
  pMVar7 = MCInst_getOperand(MI,2);
  _Var4 = MCOperand_isImm(pMVar7);
  if (_Var4) {
    pMVar7 = MCInst_getOperand(MI,2);
    iVar11 = MCOperand_getImm(pMVar7);
    if (iVar11 != 0) {
      if (bVar2) {
        SStream_concat0((SStream *)((long)&opCode + 4),",");
      }
      SStream_concat0((SStream *)((long)&opCode + 4),anon_var_dwarf_68453 + 4);
    }
  }
  s = cs_strdup((char *)((long)&opCode + 4));
  c = s;
  do {
    if (*c == '\0') {
LAB_001e7656:
      SStream_concat0(OS,s);
      if (*c != '\0') {
        SStream_concat0(OS,anon_var_dwarf_4630f + 0x11);
        for (_PrintMethodIdx = c; *_PrintMethodIdx != '\0'; _PrintMethodIdx = _PrintMethodIdx + 1) {
          if (*_PrintMethodIdx == '$') {
            pcVar12 = _PrintMethodIdx + 1;
            if (*pcVar12 == -1) {
              printCustomAliasOperand(MI,(int)_PrintMethodIdx[2] - 1,(int)_PrintMethodIdx[3] - 1,OS)
              ;
              _PrintMethodIdx = _PrintMethodIdx + 3;
            }
            else {
              printOperand(MI,(int)*pcVar12 - 1,OS);
              _PrintMethodIdx = pcVar12;
            }
          }
          else {
            SStream_concat(OS,"%c",(ulong)(uint)(int)*_PrintMethodIdx);
          }
        }
      }
      return s;
    }
    if ((*c == ' ') || (*c == '\t')) {
      *c = '\0';
      c = c + 1;
      goto LAB_001e7656;
    }
    c = c + 1;
  } while( true );
}

Assistant:

static char *printAliasInstrEx(MCInst *MI, SStream *OS, void *info)
{
#define GETREGCLASS_CONTAIN(_class, _reg) MCRegisterClass_contains(MCRegisterInfo_getRegClass(MRI, _class), MCOperand_getReg(MCInst_getOperand(MI, _reg)))
	SStream ss;
	const char *opCode;
	char *tmp, *AsmMnem, *AsmOps, *c;
	int OpIdx, PrintMethodIdx;
	int decCtr = false, needComma = false;
	MCRegisterInfo *MRI = (MCRegisterInfo *)info;

	SStream_Init(&ss);
	switch (MCInst_getOpcode(MI)) {
		default: return NULL;
		case PPC_gBC:
				 opCode = "b%s";
				 break;
		case PPC_gBCA:
				 opCode = "b%sa";
				 break;
		case PPC_gBCCTR:
				 opCode = "b%sctr";
				 break;
		case PPC_gBCCTRL:
				 opCode = "b%sctrl";
				 break;
		case PPC_gBCL:
				 opCode = "b%sl";
				 break;
		case PPC_gBCLA:
				 opCode = "b%sla";
				 break;
		case PPC_gBCLR:
				 opCode = "b%slr";
				 break;
		case PPC_gBCLRL:
				 opCode = "b%slrl";
				 break;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 0) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 1)) {
		SStream_concat(&ss, opCode, "dnzf");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 2) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 3)) {
		SStream_concat(&ss, opCode, "dzf");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 4) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 7) &&
			MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
			GETREGCLASS_CONTAIN(PPC_CRBITRCRegClassID, 1)) {
		int cr = getBICRCond(MCOperand_getReg(MCInst_getOperand(MI, 1)));
		switch(cr) {
			case CREQ:
				SStream_concat(&ss, opCode, "ne");
				break;
			case CRGT:
				SStream_concat(&ss, opCode, "le");
				break;
			case CRLT:
				SStream_concat(&ss, opCode, "ge");
				break;
			case CRUN:
				SStream_concat(&ss, opCode, "ns");
				break;
		}

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 6)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 7)
			SStream_concat0(&ss, "+");

		decCtr = false;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 8) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 9)) {
		SStream_concat(&ss, opCode, "dnzt");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 10) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 11)) {
		SStream_concat(&ss, opCode, "dzt");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 12) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 15) &&
			MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
			GETREGCLASS_CONTAIN(PPC_CRBITRCRegClassID, 1)) {
		int cr = getBICRCond(MCOperand_getReg(MCInst_getOperand(MI, 1)));
		switch(cr) {
			case CREQ:
				SStream_concat(&ss, opCode, "eq");
				break;
			case CRGT:
				SStream_concat(&ss, opCode, "gt");
				break;
			case CRLT:
				SStream_concat(&ss, opCode, "lt");
				break;
			case CRUN:
				SStream_concat(&ss, opCode, "so");
				break;
		}

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 14)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 15)
			SStream_concat0(&ss, "+");

		decCtr = false;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			((MCOperand_getImm(MCInst_getOperand(MI, 0)) & 0x12)== 16)) {
		SStream_concat(&ss, opCode, "dnz");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 24)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 25)
			SStream_concat0(&ss, "+");

		needComma = false;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			((MCOperand_getImm(MCInst_getOperand(MI, 0)) & 0x12)== 18)) {
		SStream_concat(&ss, opCode, "dz");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 26)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 27)
			SStream_concat0(&ss, "+");

		needComma = false;
	}

	if (MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
			GETREGCLASS_CONTAIN(PPC_CRBITRCRegClassID, 1) &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) < 16)) {
		int cr = getBICR(MCOperand_getReg(MCInst_getOperand(MI, 1)));

		if (decCtr) {
			needComma = true;
			SStream_concat0(&ss, " ");

			if (cr > PPC_CR0) {
				SStream_concat(&ss, "4*cr%d+", cr - PPC_CR0);
			}

			cr = getBICRCond(MCOperand_getReg(MCInst_getOperand(MI, 1)));
			switch(cr) {
				case CREQ:
					SStream_concat0(&ss, "eq");
					op_addBC(MI, PPC_BC_EQ);
					break;
				case CRGT:
					SStream_concat0(&ss, "gt");
					op_addBC(MI, PPC_BC_GT);
					break;
				case CRLT:
					SStream_concat0(&ss, "lt");
					op_addBC(MI, PPC_BC_LT);
					break;
				case CRUN:
					SStream_concat0(&ss, "so");
					op_addBC(MI, PPC_BC_SO);
					break;
			}

			cr = getBICR(MCOperand_getReg(MCInst_getOperand(MI, 1)));
			if (cr > PPC_CR0) {
				if (MI->csh->detail) {
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_CRX;
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].crx.scale = 4;
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].crx.reg = PPC_REG_CR0 + cr - PPC_CR0;
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].crx.cond = MI->flat_insn->detail->ppc.bc;
					MI->flat_insn->detail->ppc.op_count++;
				}
			}
		} else {
			if (cr > PPC_CR0) {
				needComma = true;
				SStream_concat(&ss, " cr%d", cr - PPC_CR0);
				op_addReg(MI, PPC_REG_CR0 + cr - PPC_CR0);
			}
		}
	}

	if (MCOperand_isImm(MCInst_getOperand(MI, 2)) &&
			MCOperand_getImm(MCInst_getOperand(MI, 2)) != 0) {
		if (needComma)
			SStream_concat0(&ss, ",");

		SStream_concat0(&ss, " $\xFF\x03\x01");
	}

	tmp = cs_strdup(ss.buffer);
	AsmMnem = tmp;
	for(AsmOps = tmp; *AsmOps; AsmOps++) {
		if (*AsmOps == ' ' || *AsmOps == '\t') {
			*AsmOps = '\0';
			AsmOps++;
			break;
		}
	}

	SStream_concat0(OS, AsmMnem);
	if (*AsmOps) {
		SStream_concat0(OS, "\t");
		for (c = AsmOps; *c; c++) {
			if (*c == '$') {
				c += 1;
				if (*c == (char)0xff) {
					c += 1;
					OpIdx = *c - 1;
					c += 1;
					PrintMethodIdx = *c - 1;
					printCustomAliasOperand(MI, OpIdx, PrintMethodIdx, OS);
				} else
					printOperand(MI, *c - 1, OS);
			} else {
				SStream_concat(OS, "%c", *c);
			}
		}
	}

	return tmp;
}